

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_intmath.h
# Opt level: O0

OPJ_INT32 opj_int_fix_mul(OPJ_INT32 a,OPJ_INT32 b)

{
  long lVar1;
  OPJ_INT64 temp;
  OPJ_INT32 b_local;
  OPJ_INT32 a_local;
  
  lVar1 = (long)a * (long)b + 0x1000 >> 0xd;
  if (0x7fffffff < lVar1) {
    __assert_fail("(temp >> 13) <= (OPJ_INT64)0x7FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                  ,0xfa,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
  }
  if (-0x80000001 < lVar1) {
    return (OPJ_INT32)lVar1;
  }
  __assert_fail("(temp >> 13) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                ,0xfb,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
}

Assistant:

static INLINE OPJ_INT32 opj_int_fix_mul(OPJ_INT32 a, OPJ_INT32 b)
{
#if defined(_MSC_VER) && (_MSC_VER >= 1400) && !defined(__INTEL_COMPILER) && defined(_M_IX86)
    OPJ_INT64 temp = __emul(a, b);
#else
    OPJ_INT64 temp = (OPJ_INT64) a * (OPJ_INT64) b ;
#endif
    temp += 4096;
    assert((temp >> 13) <= (OPJ_INT64)0x7FFFFFFF);
    assert((temp >> 13) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1));
    return (OPJ_INT32)(temp >> 13);
}